

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

uint32_t __thiscall
diligent_spirv_cross::CompilerGLSL::type_to_packed_size
          (CompilerGLSL *this,SPIRType *type,Bitset *flags,BufferPackingStandard packing)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  int iVar4;
  CompilerError *pCVar5;
  ulong uVar6;
  size_t sVar7;
  mapped_type *pmVar8;
  Decoration *pDVar9;
  TypedID *this_00;
  uint *puVar10;
  uint32_t base_alignment;
  uint32_t alignment;
  uint32_t packed_alignment;
  SPIRType *member_type;
  Bitset member_flags;
  uint local_48;
  uint32_t i;
  uint32_t pad_alignment;
  uint32_t size;
  uint32_t packed_size;
  BufferPackingStandard local_2c;
  Bitset *pBStack_28;
  BufferPackingStandard packing_local;
  Bitset *flags_local;
  SPIRType *type_local;
  CompilerGLSL *this_local;
  
  local_2c = packing;
  pBStack_28 = flags;
  flags_local = (Bitset *)type;
  type_local = (SPIRType *)this;
  bVar1 = Compiler::is_physical_pointer(&this->super_Compiler,type);
  if (bVar1) {
    if (((ulong)flags_local[1].higher._M_h._M_single_bucket & 0x100000000) == 0) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError(pCVar5,"Types in PhysicalStorageBufferEXT must be pointers.");
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    if ((this->super_Compiler).ir.addressing_model != AddressingModelPhysicalStorageBuffer64) {
      pCVar5 = (CompilerError *)__cxa_allocate_exception(0x10);
      CompilerError::CompilerError
                (pCVar5,
                 "AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT."
                );
      __cxa_throw(pCVar5,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    this_local._4_4_ = 8;
  }
  else {
    bVar1 = Compiler::is_array(&this->super_Compiler,(SPIRType *)flags_local);
    if (bVar1) {
      uVar3 = to_array_size_literal(this,(SPIRType *)flags_local);
      uVar2 = type_to_packed_array_stride(this,(SPIRType *)flags_local,pBStack_28,local_2c);
      pad_alignment = uVar3 * uVar2;
      bVar1 = packing_is_hlsl(local_2c);
      if ((bVar1) && ((int)(flags_local->higher)._M_h._M_bucket_count != 0xf)) {
        pad_alignment =
             pad_alignment -
             (4 - *(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt) *
             (*(uint *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4) >> 3);
      }
      this_local._4_4_ = pad_alignment;
    }
    else {
      i = 0;
      if ((int)(flags_local->higher)._M_h._M_bucket_count == 0xf) {
        local_48 = 1;
        for (member_flags.higher._M_h._M_single_bucket._4_4_ = 0;
            uVar6 = (ulong)member_flags.higher._M_h._M_single_bucket._4_4_,
            sVar7 = VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::size
                              ((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                                *)&flags_local[2].higher), uVar6 < sVar7;
            member_flags.higher._M_h._M_single_bucket._4_4_ =
                 member_flags.higher._M_h._M_single_bucket._4_4_ + 1) {
          pmVar8 = ::std::
                   unordered_map<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta,_std::hash<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::equal_to<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>_>,_std::allocator<std::pair<const_diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)0>,_diligent_spirv_cross::Meta>_>_>
                   ::operator[](&(this->super_Compiler).ir.meta,(key_type *)&flags_local->higher);
          pDVar9 = VectorView<diligent_spirv_cross::Meta::Decoration>::operator[]
                             (&(pmVar8->members).
                               super_VectorView<diligent_spirv_cross::Meta::Decoration>,
                              (ulong)member_flags.higher._M_h._M_single_bucket._4_4_);
          Bitset::Bitset((Bitset *)&member_type,&pDVar9->decoration_flags);
          this_00 = (TypedID *)
                    VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>::
                    operator[]((VectorView<diligent_spirv_cross::TypedID<(diligent_spirv_cross::Types)1>_>
                                *)&flags_local[2].higher,
                               (ulong)member_flags.higher._M_h._M_single_bucket._4_4_);
          uVar3 = TypedID::operator_cast_to_unsigned_int(this_00);
          _alignment = Compiler::get<diligent_spirv_cross::SPIRType>(&this->super_Compiler,uVar3);
          base_alignment = type_to_packed_alignment(this,_alignment,(Bitset *)&member_type,local_2c)
          ;
          puVar10 = ::std::max<unsigned_int>(&base_alignment,&local_48);
          if (_alignment->basetype == Struct) {
            local_48 = base_alignment;
          }
          else {
            local_48 = 1;
          }
          i = (i - 1) + *puVar10 & -*puVar10;
          uVar3 = type_to_packed_size(this,_alignment,(Bitset *)&member_type,local_2c);
          i = uVar3 + i;
          Bitset::~Bitset((Bitset *)&member_type);
        }
      }
      else {
        uVar3 = type_to_packed_base_size(this,(SPIRType *)flags_local,local_2c);
        bVar1 = packing_is_scalar(local_2c);
        if (bVar1) {
          i = *(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt *
              *(int *)((long)&(flags_local->higher)._M_h._M_before_begin._M_nxt + 4) * uVar3;
        }
        else {
          if (*(int *)((long)&(flags_local->higher)._M_h._M_before_begin._M_nxt + 4) == 1) {
            i = *(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt * uVar3;
          }
          bVar1 = Bitset::get(pBStack_28,5);
          if ((bVar1) &&
             (1 < *(uint *)((long)&(flags_local->higher)._M_h._M_before_begin._M_nxt + 4))) {
            bVar1 = packing_is_vec4_padded(local_2c);
            if (bVar1) {
              iVar4 = *(int *)((long)&(flags_local->higher)._M_h._M_before_begin._M_nxt + 4) * 4;
            }
            else if (*(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt == 3) {
              iVar4 = *(int *)((long)&(flags_local->higher)._M_h._M_before_begin._M_nxt + 4) * 4;
            }
            else {
              iVar4 = *(int *)((long)&(flags_local->higher)._M_h._M_before_begin._M_nxt + 4) *
                      *(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt;
            }
            i = iVar4 * uVar3;
          }
          bVar1 = Bitset::get(pBStack_28,4);
          if ((bVar1) && (1 < *(uint *)&(flags_local->higher)._M_h._M_before_begin._M_nxt)) {
            bVar1 = packing_is_vec4_padded(local_2c);
            if (bVar1) {
              iVar4 = *(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt * 4;
            }
            else if (*(int *)((long)&(flags_local->higher)._M_h._M_before_begin._M_nxt + 4) == 3) {
              iVar4 = *(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt * 4;
            }
            else {
              iVar4 = *(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt *
                      *(int *)((long)&(flags_local->higher)._M_h._M_before_begin._M_nxt + 4);
            }
            i = iVar4 * uVar3;
          }
          bVar1 = packing_is_hlsl(local_2c);
          if ((bVar1) &&
             (1 < *(uint *)((long)&(flags_local->higher)._M_h._M_before_begin._M_nxt + 4))) {
            i = i - (4 - *(int *)&(flags_local->higher)._M_h._M_before_begin._M_nxt) *
                    (*(uint *)((long)&(flags_local->higher)._M_h._M_bucket_count + 4) >> 3);
          }
        }
      }
      this_local._4_4_ = i;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t CompilerGLSL::type_to_packed_size(const SPIRType &type, const Bitset &flags, BufferPackingStandard packing)
{
	// If using PhysicalStorageBufferEXT storage class, this is a pointer,
	// and is 64-bit.
	if (is_physical_pointer(type))
	{
		if (!type.pointer)
			SPIRV_CROSS_THROW("Types in PhysicalStorageBufferEXT must be pointers.");

		if (ir.addressing_model == AddressingModelPhysicalStorageBuffer64EXT)
			return 8;
		else
			SPIRV_CROSS_THROW("AddressingModelPhysicalStorageBuffer64EXT must be used for PhysicalStorageBufferEXT.");
	}
	else if (is_array(type))
	{
		uint32_t packed_size = to_array_size_literal(type) * type_to_packed_array_stride(type, flags, packing);

		// For arrays of vectors and matrices in HLSL, the last element has a size which depends on its vector size,
		// so that it is possible to pack other vectors into the last element.
		if (packing_is_hlsl(packing) && type.basetype != SPIRType::Struct)
			packed_size -= (4 - type.vecsize) * (type.width / 8);

		return packed_size;
	}

	uint32_t size = 0;

	if (type.basetype == SPIRType::Struct)
	{
		uint32_t pad_alignment = 1;

		for (uint32_t i = 0; i < type.member_types.size(); i++)
		{
			auto member_flags = ir.meta[type.self].members[i].decoration_flags;
			auto &member_type = get<SPIRType>(type.member_types[i]);

			uint32_t packed_alignment = type_to_packed_alignment(member_type, member_flags, packing);
			uint32_t alignment = max(packed_alignment, pad_alignment);

			// The next member following a struct member is aligned to the base alignment of the struct that came before.
			// GL 4.5 spec, 7.6.2.2.
			if (member_type.basetype == SPIRType::Struct)
				pad_alignment = packed_alignment;
			else
				pad_alignment = 1;

			size = (size + alignment - 1) & ~(alignment - 1);
			size += type_to_packed_size(member_type, member_flags, packing);
		}
	}
	else
	{
		const uint32_t base_alignment = type_to_packed_base_size(type, packing);

		if (packing_is_scalar(packing))
		{
			size = type.vecsize * type.columns * base_alignment;
		}
		else
		{
			if (type.columns == 1)
				size = type.vecsize * base_alignment;

			if (flags.get(DecorationColMajor) && type.columns > 1)
			{
				if (packing_is_vec4_padded(packing))
					size = type.columns * 4 * base_alignment;
				else if (type.vecsize == 3)
					size = type.columns * 4 * base_alignment;
				else
					size = type.columns * type.vecsize * base_alignment;
			}

			if (flags.get(DecorationRowMajor) && type.vecsize > 1)
			{
				if (packing_is_vec4_padded(packing))
					size = type.vecsize * 4 * base_alignment;
				else if (type.columns == 3)
					size = type.vecsize * 4 * base_alignment;
				else
					size = type.vecsize * type.columns * base_alignment;
			}

			// For matrices in HLSL, the last element has a size which depends on its vector size,
			// so that it is possible to pack other vectors into the last element.
			if (packing_is_hlsl(packing) && type.columns > 1)
				size -= (4 - type.vecsize) * (type.width / 8);
		}
	}

	return size;
}